

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

void __thiscall Js::JavascriptArray::ProcessCorePaths(JavascriptArray *this)

{
  RuntimeContextInfo *this_00;
  char16 *val;
  TypeId TVar1;
  int iVar2;
  ScriptContext *pSVar3;
  char16 *propName;
  undefined1 local_40 [8];
  TTAutoString pathExt;
  Var aval;
  uint32 index;
  ScriptContext *ctx;
  JavascriptArray *this_local;
  
  TVar1 = RecyclableObject::GetTypeId((RecyclableObject *)this);
  if (TVar1 == TypeIds_Array) {
    pSVar3 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
    aval._4_4_ = 0xffffffff;
    while (aval._4_4_ = GetNextIndex(this,aval._4_4_), aval._4_4_ != 0xffffffff) {
      pathExt.m_optFormatBuff = (char16 *)0x0;
      iVar2 = (*(this->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                [0x70])(this,(ulong)aval._4_4_,&pathExt.m_optFormatBuff,pSVar3);
      if (iVar2 != 0) {
        TTD::UtilSupport::TTAutoString::TTAutoString((TTAutoString *)local_40);
        TTD::RuntimeContextInfo::BuildArrayIndexBuffer
                  (pSVar3->TTDWellKnownInfo,aval._4_4_,(TTAutoString *)local_40);
        val = pathExt.m_optFormatBuff;
        this_00 = pSVar3->TTDWellKnownInfo;
        propName = TTD::UtilSupport::TTAutoString::GetStrValue((TTAutoString *)local_40);
        TTD::RuntimeContextInfo::EnqueueNewPathVarAsNeeded
                  (this_00,(RecyclableObject *)this,val,propName,(char16 *)0x0);
        TTD::UtilSupport::TTAutoString::~TTAutoString((TTAutoString *)local_40);
      }
    }
    return;
  }
  TTDAbort_unrecoverable_error("Should only be used on basic arrays.");
}

Assistant:

void JavascriptArray::ProcessCorePaths()
    {
        TTDAssert(this->GetTypeId() == Js::TypeIds_Array, "Should only be used on basic arrays.");

        ScriptContext* ctx = this->GetScriptContext();

        uint32 index = Js::JavascriptArray::InvalidIndex;
        while(true)
        {
            index = this->GetNextIndex(index);
            if(index == Js::JavascriptArray::InvalidIndex) // End of array
            {
                break;
            }

            Js::Var aval = nullptr;
            if(this->DirectGetVarItemAt(index, &aval, ctx))
            {
                TTD::UtilSupport::TTAutoString pathExt;
                ctx->TTDWellKnownInfo->BuildArrayIndexBuffer(index, pathExt);

                ctx->TTDWellKnownInfo->EnqueueNewPathVarAsNeeded(this, aval, pathExt.GetStrValue());
            }
        }
    }